

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

QNode * despot::DESPOT::Prune(QNode *qnode,double *pruned_value)

{
  QNode *this;
  int edge;
  QNode *this_00;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  VNode *this_01;
  mapped_type *ppVVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Self __tmp;
  double dVar5;
  ValuedAction VVar6;
  double nu;
  ACT_TYPE astar;
  double local_50;
  QNode *local_48;
  double *local_40;
  ACT_TYPE local_34;
  
  this_00 = (QNode *)operator_new(0x88);
  edge = QNode::edge(qnode);
  QNode::QNode(this_00,(VNode *)0x0,edge);
  *pruned_value = qnode->step_reward - DAT_00192dd0;
  local_48 = qnode;
  pmVar1 = QNode::children(qnode);
  p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    local_40 = pruned_value;
    do {
      this_01 = Prune((VNode *)p_Var3[1]._M_parent,&local_34,&local_50);
      dVar5 = local_50;
      VVar6 = VNode::default_move((VNode *)p_Var3[1]._M_parent);
      if ((dVar5 != VVar6.value) || (NAN(dVar5) || NAN(VVar6.value))) {
        pmVar1 = QNode::children(this_00);
        pruned_value = local_40;
        ppVVar2 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](pmVar1,(key_type *)(p_Var3 + 1));
        *ppVVar2 = this_01;
        VNode::parent(this_01,this_00);
      }
      else {
        VNode::~VNode(this_01);
        operator_delete(this_01,0x98);
      }
      *pruned_value = dVar5 + *pruned_value;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  this = local_48;
  dVar5 = QNode::lower_bound(local_48);
  QNode::lower_bound(this_00,dVar5);
  dVar5 = QNode::upper_bound(this);
  QNode::upper_bound(this_00,dVar5);
  return this_00;
}

Assistant:

QNode* DESPOT::Prune(QNode* qnode, double& pruned_value) {
	QNode* pruned_q = new QNode((VNode*) NULL, qnode->edge());
	pruned_value = qnode->step_reward - Globals::config.pruning_constant;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		ACT_TYPE astar;
		double nu;
		VNode* pruned_v = Prune(it->second, astar, nu);
		if (nu == it->second->default_move().value) {
			delete pruned_v;
		} else {
			pruned_q->children()[it->first] = pruned_v;
			pruned_v->parent(pruned_q);
		}
		pruned_value += nu;
	}

	pruned_q->lower_bound(qnode->lower_bound()); // for debugging
	pruned_q->upper_bound(qnode->upper_bound()); // for debugging

	return pruned_q;
}